

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsd_symbol.cpp
# Opt level: O3

void __thiscall DSDcc::DSDSymbol::noCarrier(DSDSymbol *this)

{
  this->m_sampleIndex = 0;
  this->m_sum = 0;
  this->m_count = 0;
  this->m_zeroCrossing = 0;
  this->m_zeroCrossingInCycle = false;
  this->m_zeroCrossingPos = 0;
  this->m_min = 0;
  this->m_max = 0;
  this->m_center = 0;
  this->m_filteredSample = 0;
  return;
}

Assistant:

void DSDSymbol::noCarrier()
{
    resetSymbol();
    resetZeroCrossing();
    m_max = 0;
    m_min = 0;
    m_center = 0;
    m_filteredSample = 0;
}